

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall
SQCompilation::CheckerVisitor::checkCopyOfExpression(CheckerVisitor *this,BinExpr *bin)

{
  TreeOp TVar1;
  Node *lhs;
  bool bVar2;
  BinExpr *binCmp;
  
  if ((this->effectsOnly == false) &&
     (TVar1 = (bin->super_Expr).super_Node._op, 0xfffffffc < TVar1 - TO_XOR)) {
    lhs = &bin->_lhs->super_Node;
    while (bin = (BinExpr *)bin->_rhs, (bin->super_Expr).super_Node._op == TVar1) {
      bVar2 = NodeEqualChecker::check
                        ((NodeEqualChecker *)&this->field_0x20,lhs,&bin->_lhs->super_Node);
      if ((bVar2) ||
         (bVar2 = NodeEqualChecker::check
                            ((NodeEqualChecker *)&this->field_0x20,lhs,&bin->_rhs->super_Node),
         bVar2)) {
        report(this,(Node *)bin,0x52);
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkCopyOfExpression(const BinExpr *bin) {

  if (effectsOnly)
    return;

  enum TreeOp op = bin->op();
  if (op != TO_OROR && op != TO_ANDAND && op != TO_OR)
    return;

  const Expr *lhs = bin->lhs();
  const Expr *cmp = bin->rhs();

  while (cmp->op() == op) {
    const BinExpr *binCmp = static_cast<const BinExpr *>(cmp);

    if (_equalChecker.check(lhs, binCmp->lhs()) || _equalChecker.check(lhs, binCmp->rhs())) {
      report(binCmp, DiagnosticsId::DI_COPY_OF_EXPR);
    }
    cmp = binCmp->rhs();
  }
}